

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_SetSourceSampleRate
                   (FAudioSourceVoice *voice,uint32_t NewSourceSampleRate)

{
  ushort uVar1;
  code *pcVar2;
  int iVar3;
  uint32_t uVar4;
  uint in_ESI;
  long *in_RDI;
  double dVar5;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32_t newResampleSamples;
  uint32_t newDecodeSamples;
  uint32_t outSampleRate;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  uint in_stack_ffffffffffffffd4;
  uint32_t local_4;
  
  do {
    if (*(int *)((long)in_RDI + 0xc) == 0) goto LAB_001296e1;
    iVar3 = SDL_ReportAssertion(&FAudioSourceVoice_SetSourceSampleRate::sdl_assert_data,
                                "FAudioSourceVoice_SetSourceSampleRate",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xb10);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_001296e1:
  do {
    uVar6 = in_stack_ffffffffffffffd4 & 0xffffff;
    if (999 < in_ESI) {
      uVar6 = CONCAT13(in_ESI < 0x30d41,(int3)in_stack_ffffffffffffffd4);
    }
    in_stack_ffffffffffffffd4 = uVar6;
    if ((((byte)(in_stack_ffffffffffffffd4 >> 0x18) ^ 0xff) & 1) == 0) goto LAB_00129744;
    iVar3 = SDL_ReportAssertion(&FAudioSourceVoice_SetSourceSampleRate::sdl_assert_data_1,
                                "FAudioSourceVoice_SetSourceSampleRate",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0xb12);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_00129744:
  FAudio_PlatformLockMutex((FAudioMutex)0x129757);
  if ((*(byte *)*in_RDI < 8) || (in_RDI[0x26] == 0)) {
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1297a5);
    *(uint *)(in_RDI[0x1f] + 4) = in_ESI;
    dVar5 = (double)SDL_ceil(((double)*(uint *)(*in_RDI + 0xc) *
                              (double)*(float *)((long)in_RDI + 0xf4) * (double)in_ESI) /
                             (double)*(uint *)(*(long *)(*in_RDI + 0x10) + 0xdc));
    uVar1 = *(ushort *)(in_RDI[0x1f] + 2);
    FAudio_INTERNAL_ResizeDecodeCache
              ((FAudio *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    *(uint *)(in_RDI + 0x19) = (int)(long)dVar5 + (uint)uVar1 * 2;
    FAudio_PlatformLockMutex((FAudioMutex)0x129861);
    if ((int)in_RDI[2] == 0) {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x12987d);
      local_4 = 0;
    }
    else {
      if (*(int *)(*(long *)(*(long *)((long)in_RDI + 0x14) + 4) + 0xc) == 2) {
        uVar6 = *(uint *)(*(long *)(*(long *)((long)in_RDI + 0x14) + 4) + 0xdc);
      }
      else {
        uVar6 = *(uint *)(*(long *)(*(long *)((long)in_RDI + 0x14) + 4) + 0xec);
      }
      dVar5 = (double)SDL_ceil(((double)*(uint *)(*in_RDI + 0xc) * (double)uVar6) /
                               (double)*(uint *)(*(long *)(*in_RDI + 0x10) + 0xdc));
      *(int *)((long)in_RDI + 0xcc) = (int)(long)dVar5;
      FAudio_PlatformUnlockMutex((FAudioMutex)0x129933);
      local_4 = 0;
    }
  }
  else {
    FAudio_PlatformUnlockMutex((FAudioMutex)0x129787);
    local_4 = 0x88960001;
  }
  return local_4;
}

Assistant:

uint32_t FAudioSourceVoice_SetSourceSampleRate(
	FAudioSourceVoice *voice,
	uint32_t NewSourceSampleRate
) {
	uint32_t outSampleRate;
	uint32_t newDecodeSamples, newResampleSamples;

	LOG_API_ENTER(voice->audio)
	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);
	FAudio_assert(	NewSourceSampleRate >= FAUDIO_MIN_SAMPLE_RATE &&
			NewSourceSampleRate <= FAUDIO_MAX_SAMPLE_RATE	);

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)
	if (	voice->audio->version > 7 &&
		voice->src.bufferList != NULL	)
	{
		FAudio_PlatformUnlockMutex(voice->src.bufferLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}
	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)

	voice->src.format->nSamplesPerSec = NewSourceSampleRate;

	/* Resize decode cache */
	newDecodeSamples = (uint32_t) FAudio_ceil(
		voice->audio->updateSize *
		(double) voice->src.maxFreqRatio *
		(double) NewSourceSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	) + EXTRA_DECODE_PADDING * voice->src.format->nChannels;
	FAudio_INTERNAL_ResizeDecodeCache(
		voice->audio,
		(newDecodeSamples + EXTRA_DECODE_PADDING) * voice->src.format->nChannels
	);
	voice->src.decodeSamples = newDecodeSamples;

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	if (voice->sends.SendCount == 0)
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}
	outSampleRate = voice->sends.pSends[0].pOutputVoice->type == FAUDIO_VOICE_MASTER ?
		voice->sends.pSends[0].pOutputVoice->master.inputSampleRate :
		voice->sends.pSends[0].pOutputVoice->mix.inputSampleRate;

	newResampleSamples = (uint32_t) (FAudio_ceil(
		(double) voice->audio->updateSize *
		(double) outSampleRate /
		(double) voice->audio->master->master.inputSampleRate
	));
	voice->src.resampleSamples = newResampleSamples;

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}